

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# euarel.cc
# Opt level: O0

string * OB::Euarel::url_decode(string *__return_storage_ptr__,string *str,bool form)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  byte *pbVar6;
  string local_58;
  ulong local_38;
  size_t i;
  undefined1 local_1a;
  byte local_19;
  string *psStack_18;
  bool form_local;
  string *str_local;
  string *res;
  
  local_1a = 0;
  local_19 = form;
  psStack_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  local_38 = 0;
  do {
    uVar5 = local_38;
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uVar5) {
      return __return_storage_ptr__;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    if ((*pcVar4 == '+') && ((local_19 & 1) != 0)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      if ((*pcVar4 == '%') &&
         (uVar5 = local_38 + 2, uVar3 = std::__cxx11::string::size(), uVar5 < uVar3)) {
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)psStack_18);
        iVar2 = isxdigit((uint)*pbVar6);
        if (iVar2 != 0) {
          pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)psStack_18);
          iVar2 = isxdigit((uint)*pbVar6);
          if (iVar2 != 0) {
            std::__cxx11::string::substr((ulong)&local_58,(ulong)psStack_18);
            cVar1 = hex_decode(&local_58);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
            std::__cxx11::string::~string((string *)&local_58);
            local_38 = local_38 + 2;
            goto LAB_0010ff17;
          }
        }
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
    }
LAB_0010ff17:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

std::string url_decode(std::string const& str, bool form)
{
  std::string res;
  res.reserve(str.size());

  for (std::size_t i = 0; i < str.size(); ++i)
  {
    if (str[i] == '+' && form)
    {
      res += " ";
    }
    else if (str[i] == '%' && i + 2 < str.size() &&
      std::isxdigit(static_cast<unsigned char>(str[i + 1])) &&
      std::isxdigit(static_cast<unsigned char>(str[i + 2])))
    {
      res += hex_decode(str.substr(i + 1, 2));
      i += 2;
    }
    else
    {
      res += str[i];
    }
  }

  return res;
}